

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

void __thiscall
JsUtil::BackgroundJobProcessor::~BackgroundJobProcessor(BackgroundJobProcessor *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_14;
  uint i;
  BackgroundJobProcessor *this_local;
  
  bVar2 = JobProcessor::IsClosed(&this->super_JobProcessor);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x296,"(IsClosed())","IsClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->parallelThreadData != (ParallelThreadData **)0x0) {
    for (local_14 = 0; local_14 < this->threadCount; local_14 = local_14 + 1) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::ParallelThreadData>
                (&Memory::HeapAllocator::Instance,this->parallelThreadData[local_14]);
    }
    Memory::DeleteArray<Memory::HeapAllocator,JsUtil::ParallelThreadData*>
              (&Memory::HeapAllocator::Instance,(ulong)this->maxThreadCount,this->parallelThreadData
              );
  }
  Event::~Event(&this->wakeAllBackgroundThreads);
  Event::~Event(&this->jobReady);
  CriticalSection::~CriticalSection(&this->criticalSection);
  return;
}

Assistant:

BackgroundJobProcessor::~BackgroundJobProcessor()
    {
        // This should appear to be called from the same thread from which this instance was created
        Assert(IsClosed());

        if (parallelThreadData)
        {
            for (unsigned int i = 0; i < this->threadCount; i++)
            {
                HeapDelete(parallelThreadData[i]);
            }
            HeapDeleteArray(this->maxThreadCount, parallelThreadData);
        }
    }